

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Value::set_allocated_immediatevalue
          (Value *this,Value_ImmediateValue *immediatevalue)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (immediatevalue != (Value_ImmediateValue *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(immediatevalue->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      immediatevalue =
           (Value_ImmediateValue *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&immediatevalue->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 3;
    (this->value_).immediatevalue_ = immediatevalue;
  }
  return;
}

Assistant:

void Value::set_allocated_immediatevalue(::CoreML::Specification::MILSpec::Value_ImmediateValue* immediatevalue) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (immediatevalue) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::Value_ImmediateValue>::GetOwningArena(immediatevalue);
    if (message_arena != submessage_arena) {
      immediatevalue = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, immediatevalue, submessage_arena);
    }
    set_has_immediatevalue();
    value_.immediatevalue_ = immediatevalue;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.Value.immediateValue)
}